

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizardPrivate::updateMinMaxSizes(QWizardPrivate *this,QWizardLayoutInfo *info)

{
  long lVar1;
  int iVar2;
  int iVar3;
  QSize *s2;
  QSize this_00;
  QWidget *in_RSI;
  QWizardPrivate *in_RDI;
  long in_FS_OFFSET;
  int extraHeight;
  QWizard *q;
  QSize maximumSize;
  QSize minimumSize;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar4;
  int h;
  QWizardPrivate *pQVar5;
  QSize in_stack_ffffffffffffffd0;
  QLayout *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = in_RDI;
  s2 = (QSize *)q_func(in_RDI);
  iVar3 = (int)((ulong)pQVar5 >> 0x20);
  uVar4 = 0;
  QLayout::totalMinimumSize((QLayout *)&DAT_aaaaaaaaaaaaaaaa);
  QSize::QSize((QSize *)CONCAT44(uVar4,in_stack_ffffffffffffffb0),(int)((ulong)in_RDI >> 0x20),
               (int)in_RDI);
  this_00 = ::operator+((QSize *)in_RSI,s2);
  h = (int)((ulong)s2 >> 0x20);
  QLayout::totalMaximumSize(in_stack_ffffffffffffffe0);
  if ((in_RSI[1].field_0x8 & 1) != 0) {
    iVar2 = QWidget::maximumWidth((QWidget *)CONCAT44(uVar4,in_stack_ffffffffffffffb0));
    if (iVar2 != 0xffffff) {
      QWidget::maximumWidth((QWidget *)CONCAT44(uVar4,in_stack_ffffffffffffffb0));
      QSize::setWidth((QSize *)CONCAT44(uVar4,in_stack_ffffffffffffffb0),
                      (int)((ulong)in_RDI >> 0x20));
      QWidget::maximumWidth((QWidget *)CONCAT44(uVar4,in_stack_ffffffffffffffb0));
      QSize::setWidth((QSize *)CONCAT44(uVar4,in_stack_ffffffffffffffb0),
                      (int)((ulong)in_RDI >> 0x20));
    }
  }
  if (((in_RSI[1].field_0x9 & 1) != 0) && ((in_RSI[1].field_0xd & 1) == 0)) {
    in_stack_ffffffffffffffd0 = QLayout::totalSizeHint((QLayout *)this_00);
    QSize::height((QSize *)0x7b9486);
    QSize::setHeight((QSize *)CONCAT44(uVar4,in_stack_ffffffffffffffb0),(int)((ulong)in_RDI >> 0x20)
                    );
  }
  iVar2 = QWidget::minimumWidth((QWidget *)CONCAT44(uVar4,in_stack_ffffffffffffffb0));
  if (iVar2 == in_RDI->minimumWidth) {
    iVar2 = QSize::width((QSize *)0x7b94b2);
    in_RDI->minimumWidth = iVar2;
    QWidget::setMinimumWidth((QWidget *)in_stack_ffffffffffffffd0,iVar3);
  }
  iVar2 = QWidget::minimumHeight((QWidget *)CONCAT44(uVar4,in_stack_ffffffffffffffb0));
  if (iVar2 == in_RDI->minimumHeight) {
    iVar2 = QSize::height((QSize *)0x7b94ee);
    in_RDI->minimumHeight = iVar2;
    QWidget::setMinimumHeight(in_RSI,h);
  }
  iVar2 = QWidget::maximumWidth((QWidget *)CONCAT44(uVar4,in_stack_ffffffffffffffb0));
  if (iVar2 == in_RDI->maximumWidth) {
    iVar2 = QSize::width((QSize *)0x7b952a);
    in_RDI->maximumWidth = iVar2;
    QWidget::setMaximumWidth((QWidget *)in_stack_ffffffffffffffd0,iVar3);
  }
  iVar3 = QWidget::maximumHeight((QWidget *)CONCAT44(uVar4,in_stack_ffffffffffffffb0));
  if (iVar3 == in_RDI->maximumHeight) {
    iVar3 = QSize::height((QSize *)0x7b9566);
    in_RDI->maximumHeight = iVar3;
    QWidget::setMaximumHeight(in_RSI,h);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPrivate::updateMinMaxSizes(const QWizardLayoutInfo &info)
{
    Q_Q(QWizard);

    int extraHeight = 0;
#if QT_CONFIG(style_windowsvista)
    if (isVistaThemeEnabled())
        extraHeight = vistaHelper->titleBarSize() + vistaHelper->topOffset(q);
#endif
    QSize minimumSize = mainLayout->totalMinimumSize() + QSize(0, extraHeight);
    QSize maximumSize = mainLayout->totalMaximumSize();
    if (info.header && headerWidget->maximumWidth() != QWIDGETSIZE_MAX) {
        minimumSize.setWidth(headerWidget->maximumWidth());
        maximumSize.setWidth(headerWidget->maximumWidth());
    }
    if (info.watermark && !info.sideWidget) {
        minimumSize.setHeight(mainLayout->totalSizeHint().height());
    }
    if (q->minimumWidth() == minimumWidth) {
        minimumWidth = minimumSize.width();
        q->setMinimumWidth(minimumWidth);
    }
    if (q->minimumHeight() == minimumHeight) {
        minimumHeight = minimumSize.height();
        q->setMinimumHeight(minimumHeight);
    }
    if (q->maximumWidth() == maximumWidth) {
        maximumWidth = maximumSize.width();
        q->setMaximumWidth(maximumWidth);
    }
    if (q->maximumHeight() == maximumHeight) {
        maximumHeight = maximumSize.height();
        q->setMaximumHeight(maximumHeight);
    }
}